

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O2

void __thiscall grid::grid(grid *this,int size)

{
  int j;
  entity ***pppeVar1;
  entity **ppeVar2;
  ulong uVar3;
  bool **ppbVar4;
  entity *peVar5;
  bool *pbVar6;
  int j_1;
  ulong uVar7;
  ulong uVar8;
  int i;
  ulong uVar9;
  ulong uVar10;
  _Vector_base<entity_*,_std::allocator<entity_*>_> local_60;
  vector<entity_*,_std::allocator<entity_*>_> entitiesToBeAdded;
  
  this->_vptr_grid = (_func_int **)&PTR__grid_0010ac80;
  this->size = size;
  this->medkitsDiscovered = false;
  this->zombiesVisible = false;
  this->ammunitionDiscovered = false;
  this->directionOperations[0] = (int  [2])0xffffffff;
  this->directionOperations[1] = (int  [2])0x1ffffffff;
  this->directionOperations[2] = (int  [2])0x100000000;
  this->directionOperations[3] = (int  [2])0x100000001;
  this->directionOperations[4] = (int  [2])0x1;
  this->directionOperations[5] = (int  [2])0xffffffff00000001;
  this->directionOperations[6] = (int  [2])0xffffffff00000000;
  this->directionOperations[7] = (int  [2])0xffffffffffffffff;
  uVar9 = (ulong)size;
  uVar7 = 0;
  uVar10 = 0xffffffffffffffff;
  if (-1 < size) {
    uVar10 = uVar9 * 8;
  }
  uVar8 = 0;
  if (0 < size) {
    uVar8 = (ulong)(uint)size;
  }
  pppeVar1 = (entity ***)operator_new__(uVar10);
  this->board = pppeVar1;
  while( true ) {
    ppeVar2 = (entity **)operator_new__(uVar10);
    if (uVar7 == uVar8) break;
    this->board[uVar7] = ppeVar2;
    for (uVar3 = 0; (uint)size != uVar3; uVar3 = uVar3 + 1) {
      this->board[uVar7][uVar3] = (entity *)0x0;
    }
    uVar7 = uVar7 + 1;
  }
  this->visitedByChichonne = (bool **)ppeVar2;
  ppbVar4 = (bool **)operator_new__(uVar10);
  this->visitedByDerek = ppbVar4;
  for (uVar10 = 0; uVar10 != uVar8; uVar10 = uVar10 + 1) {
    peVar5 = (entity *)operator_new__(uVar9);
    ppeVar2[uVar10] = peVar5;
    pbVar6 = (bool *)operator_new__(uVar9);
    this->visitedByDerek[uVar10] = pbVar6;
    ppbVar4 = this->visitedByDerek;
    ppeVar2 = (entity **)this->visitedByChichonne;
    for (uVar7 = 0; (uint)size != uVar7; uVar7 = uVar7 + 1) {
      *(undefined1 *)((long)&ppeVar2[uVar10]->type + uVar7) = 0;
      ppbVar4[uVar10][uVar7] = false;
    }
  }
  createEntities(&entitiesToBeAdded,this);
  std::vector<entity_*,_std::allocator<entity_*>_>::vector
            ((vector<entity_*,_std::allocator<entity_*>_> *)&local_60,&entitiesToBeAdded);
  deploy(this,(vector<entity_*,_std::allocator<entity_*>_> *)&local_60);
  std::_Vector_base<entity_*,_std::allocator<entity_*>_>::~_Vector_base(&local_60);
  std::_Vector_base<entity_*,_std::allocator<entity_*>_>::~_Vector_base
            (&entitiesToBeAdded.super__Vector_base<entity_*,_std::allocator<entity_*>_>);
  return;
}

Assistant:

grid::grid(int size) : size(size),zombiesVisible(false), medkitsDiscovered(false), ammunitionDiscovered(false) {
    board = new entity **[size];
    for (int i = 0; i < size; ++i) {
        board[i] = new entity *[size];
        for (int j = 0; j < size; ++j) {
            board[i][j] = nullptr;
        }
    }

    visitedByChichonne = new bool*[size];
    visitedByDerek = new bool*[size];
    for (int i = 0; i < size; ++i) {
        visitedByChichonne[i] = new bool[size];
        visitedByDerek[i] = new bool[size];
        for (int j = 0; j < size; ++j) {
            visitedByChichonne[i][j] = false;
            visitedByDerek[i][j] = false;
        }
    }
    std::vector<entity *> entitiesToBeAdded = createEntities();
    deploy(entitiesToBeAdded);
}